

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsInterface.cpp
# Opt level: O2

HighsStatus __thiscall
Highs::addColsInterface
          (Highs *this,HighsInt ext_num_new_col,double *ext_col_cost,double *ext_col_lower,
          double *ext_col_upper,HighsInt ext_num_new_nz,HighsInt *ext_a_start,HighsInt *ext_a_index,
          double *ext_a_value)

{
  vector<double,_std::allocator<double>_> *this_00;
  int iVar1;
  HighsInt HVar2;
  pointer pdVar3;
  bool bVar4;
  HighsStatus HVar5;
  HighsStatus HVar6;
  HighsStatus call_status;
  ulong uVar7;
  char *format;
  ulong uVar8;
  undefined4 in_register_00000034;
  ulong uVar9;
  size_type __new_size;
  int num_new_col;
  double dVar10;
  allocator_type local_35b;
  bool local_has_infinite_cost;
  allocator local_359;
  HighsLogOptions *local_358;
  HighsLp *local_350;
  string local_348;
  HighsInt *local_328;
  ulong local_320;
  ulong local_318;
  vector<double,_std::allocator<double>_> local_colUpper;
  vector<double,_std::allocator<double>_> local_colLower;
  vector<double,_std::allocator<double>_> local_colCost;
  HighsSparseMatrix local_a_matrix;
  HighsIndexCollection local_250;
  string local_200;
  string local_1e0;
  HighsLogOptions local_1c0;
  HighsLogOptions local_160;
  HighsLogOptions local_100;
  HighsSparseMatrix local_a0;
  
  local_318 = CONCAT44(in_register_00000034,ext_num_new_col);
  if ((ext_num_new_nz | ext_num_new_col) < 0) {
    return kError;
  }
  if (ext_num_new_col == 0) {
    return kOk;
  }
  local_358 = &(this->options_).super_HighsOptionsStruct.log_options;
  bVar4 = isColDataNull(local_358,ext_col_cost,ext_col_lower,ext_col_upper);
  if (bVar4) {
    return kError;
  }
  if (ext_num_new_nz != 0) {
    bVar4 = isMatrixDataNull(local_358,ext_a_start,ext_a_index,ext_a_value);
    if (bVar4) {
      return kError;
    }
    if ((this->model_).lp_.num_row_ < 1) {
      return kError;
    }
  }
  local_328 = &(this->model_).lp_.num_row_;
  iVar1 = (this->model_).lp_.num_col_;
  local_250.is_set_ = false;
  local_250.set_num_entries_ = -1;
  local_250.mask_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_250.mask_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_250.mask_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_250.set_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_250.set_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish._0_1_ = 0;
  local_250.set_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish._1_7_ = 0;
  local_250.set_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._0_1_ = 0;
  local_250._41_8_ = 0;
  local_250.dimension_ = (HighsInt)local_318;
  local_250.is_interval_ = true;
  local_250.from_ = 0;
  local_250.to_ = local_250.dimension_ + -1;
  uVar8 = local_318 & 0xffffffff;
  std::vector<double,std::allocator<double>>::vector<double_const*,void>
            ((vector<double,std::allocator<double>> *)&local_colCost,ext_col_cost,
             ext_col_cost + uVar8,(allocator_type *)&local_a_matrix);
  std::vector<double,std::allocator<double>>::vector<double_const*,void>
            ((vector<double,std::allocator<double>> *)&local_colLower,ext_col_lower,
             ext_col_lower + uVar8,(allocator_type *)&local_a_matrix);
  local_320 = uVar8;
  std::vector<double,std::allocator<double>>::vector<double_const*,void>
            ((vector<double,std::allocator<double>> *)&local_colUpper,ext_col_upper,
             ext_col_upper + uVar8,(allocator_type *)&local_a_matrix);
  local_has_infinite_cost = false;
  HighsLogOptions::HighsLogOptions(&local_100,local_358);
  uVar8 = local_318;
  HVar5 = assessCosts(&this->options_,(this->model_).lp_.num_col_,&local_250,&local_colCost,
                      &local_has_infinite_cost,
                      (this->options_).super_HighsOptionsStruct.infinite_cost);
  std::__cxx11::string::string((string *)&local_a_matrix,"assessCosts",(allocator *)&local_348);
  HVar6 = interpretCallStatus(&local_100,HVar5,kOk,(string *)&local_a_matrix);
  std::__cxx11::string::~string((string *)&local_a_matrix);
  std::_Function_base::~_Function_base(&local_100.user_callback.super__Function_base);
  HVar5 = kError;
  if (HVar6 == kError) goto LAB_0024fef6;
  HighsLogOptions::HighsLogOptions(&local_160,local_358);
  call_status = assessBounds(&this->options_,"Col",(this->model_).lp_.num_col_,&local_250,
                             &local_colLower,&local_colUpper,
                             (this->options_).super_HighsOptionsStruct.infinite_bound,
                             (HighsVarType *)0x0);
  std::__cxx11::string::string((string *)&local_a_matrix,"assessBounds",(allocator *)&local_348);
  HVar6 = interpretCallStatus(&local_160,call_status,HVar6,(string *)&local_a_matrix);
  std::__cxx11::string::~string((string *)&local_a_matrix);
  std::_Function_base::~_Function_base(&local_160.user_callback.super__Function_base);
  if (HVar6 == kError) goto LAB_0024fef6;
  HVar2 = (this->model_).lp_.user_bound_scale_;
  num_new_col = (int)uVar8;
  if (HVar2 != 0) {
    bVar4 = boundScaleOk(&local_colLower,&local_colUpper,HVar2,
                         (this->options_).super_HighsOptionsStruct.infinite_bound);
    if (bVar4) {
      dVar10 = ldexp(1.0,(this->model_).lp_.user_bound_scale_);
      uVar7 = 0;
      uVar9 = 0;
      if (0 < num_new_col) {
        uVar9 = uVar8 & 0xffffffff;
      }
      for (; uVar9 != uVar7; uVar7 = uVar7 + 1) {
        local_colLower.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start[uVar7] =
             local_colLower.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[uVar7] * dVar10;
        local_colUpper.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start[uVar7] =
             local_colUpper.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[uVar7] * dVar10;
      }
      goto LAB_0024fac8;
    }
    format = "User bound scaling yields infinite bound\n";
LAB_0024fd2e:
    highsLogUser(local_358,kError,format);
    goto LAB_0024fef6;
  }
LAB_0024fac8:
  HVar2 = (this->model_).lp_.user_cost_scale_;
  if (HVar2 != 0) {
    bVar4 = costScaleOk(&local_colCost,HVar2,(this->options_).super_HighsOptionsStruct.infinite_cost
                       );
    if (!bVar4) {
      format = "User cost scaling yields infinite cost\n";
      goto LAB_0024fd2e;
    }
    dVar10 = ldexp(1.0,(this->model_).lp_.user_cost_scale_);
    uVar7 = 0;
    uVar9 = 0;
    if (0 < num_new_col) {
      uVar9 = uVar8 & 0xffffffff;
    }
    for (; uVar9 != uVar7; uVar7 = uVar7 + 1) {
      local_colCost.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start[uVar7] =
           local_colCost.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start[uVar7] * dVar10;
    }
  }
  local_350 = &(this->model_).lp_;
  appendColsToLpVectors(local_350,num_new_col,&local_colCost,&local_colLower,&local_colUpper);
  HighsSparseMatrix::HighsSparseMatrix(&local_a_matrix);
  local_a_matrix.num_row_ = *local_328;
  local_a_matrix.format_ = kColwise;
  local_a_matrix.num_col_ = num_new_col;
  if (ext_num_new_nz == 0) {
    local_348._M_dataplus._M_p._0_4_ = 0;
    std::vector<int,_std::allocator<int>_>::_M_fill_assign
              (&local_a_matrix.start_,(ulong)(num_new_col + 1),(value_type_conflict2 *)&local_348);
LAB_0024fd5b:
    HighsSparseMatrix::HighsSparseMatrix(&local_a0,&local_a_matrix);
    HighsSparseMatrix::addCols(&(this->model_).lp_.a_matrix_,&local_a0,(int8_t *)0x0);
    HighsSparseMatrix::~HighsSparseMatrix(&local_a0);
    if ((this->model_).lp_.scale_.has_scaling == true) {
      __new_size = (long)iVar1 + (long)num_new_col;
      this_00 = &(this->model_).lp_.scale_.col;
      std::vector<double,_std::allocator<double>_>::resize(this_00,__new_size);
      iVar1 = ((HighsLp *)&local_350->num_col_)->num_col_;
      uVar7 = 0;
      uVar9 = 0;
      if (0 < num_new_col) {
        uVar9 = uVar8 & 0xffffffff;
      }
      pdVar3 = (this_00->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      for (; uVar9 != uVar7; uVar7 = uVar7 + 1) {
        pdVar3[(long)iVar1 + uVar7] = 1.0;
      }
      (this->model_).lp_.scale_.num_col = (HighsInt)__new_size;
      HighsSparseMatrix::applyRowScale(&local_a_matrix,&(this->model_).lp_.scale_);
      HighsSparseMatrix::considerColScaling
                (&local_a_matrix,
                 (this->options_).super_HighsOptionsStruct.allowed_matrix_scale_factor,
                 (this->model_).lp_.scale_.col.super__Vector_base<double,_std::allocator<double>_>.
                 _M_impl.super__Vector_impl_data._M_start + (this->model_).lp_.num_col_);
    }
    if ((this->basis_).useful == true) {
      appendNonbasicColsToBasisInterface(this,num_new_col);
    }
    std::__cxx11::string::string((string *)&local_200,"",(allocator *)&local_348);
    HighsLp::addColNames(local_350,&local_200,num_new_col);
    std::__cxx11::string::~string((string *)&local_200);
    (this->model_).lp_.num_col_ = (this->model_).lp_.num_col_ + num_new_col;
    bVar4 = true;
    if ((this->model_).lp_.has_infinite_cost_ == false) {
      bVar4 = local_has_infinite_cost;
    }
    (this->model_).lp_.has_infinite_cost_ = bVar4;
    invalidateModelStatusSolutionAndInfo(this);
    HEkk::addCols(&this->ekk_instance_,local_350,&local_a_matrix);
    HVar5 = HVar6;
    if ((this->model_).hessian_.dim_ != 0) {
      completeHessian(((HighsLp *)&local_350->num_col_)->num_col_,&(this->model_).hessian_);
    }
  }
  else {
    std::vector<int,std::allocator<int>>::vector<int_const*,void>
              ((vector<int,std::allocator<int>> *)&local_348,ext_a_start,ext_a_start + local_320,
               &local_35b);
    std::vector<int,_std::allocator<int>_>::_M_move_assign(&local_a_matrix.start_,&local_348);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)&local_348);
    std::vector<int,_std::allocator<int>_>::resize(&local_a_matrix.start_,(ulong)(num_new_col + 1));
    local_a_matrix.start_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_start[local_320] = ext_num_new_nz;
    std::vector<int,std::allocator<int>>::vector<int_const*,void>
              ((vector<int,std::allocator<int>> *)&local_348,ext_a_index,
               ext_a_index + (uint)ext_num_new_nz,&local_35b);
    std::vector<int,_std::allocator<int>_>::_M_move_assign(&local_a_matrix.index_,&local_348);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)&local_348);
    std::vector<double,std::allocator<double>>::vector<double_const*,void>
              ((vector<double,std::allocator<double>> *)&local_348,ext_a_value,
               ext_a_value + (uint)ext_num_new_nz,(allocator_type *)&local_35b);
    std::vector<double,_std::allocator<double>_>::_M_move_assign(&local_a_matrix.value_,&local_348);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              ((_Vector_base<double,_std::allocator<double>_> *)&local_348);
    HighsLogOptions::HighsLogOptions(&local_1c0,local_358);
    std::__cxx11::string::string((string *)&local_1e0,"LP",(allocator *)&local_35b);
    HVar5 = HighsSparseMatrix::assess
                      (&local_a_matrix,local_358,&local_1e0,
                       (this->options_).super_HighsOptionsStruct.small_matrix_value,
                       (this->options_).super_HighsOptionsStruct.large_matrix_value);
    std::__cxx11::string::string((string *)&local_348,"assessMatrix",&local_359);
    HVar6 = interpretCallStatus(&local_1c0,HVar5,HVar6,&local_348);
    std::__cxx11::string::~string((string *)&local_348);
    std::__cxx11::string::~string((string *)&local_1e0);
    std::_Function_base::~_Function_base(&local_1c0.user_callback.super__Function_base);
    if (HVar6 != kError) goto LAB_0024fd5b;
    HVar5 = kError;
  }
  HighsSparseMatrix::~HighsSparseMatrix(&local_a_matrix);
LAB_0024fef6:
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&local_colUpper.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&local_colLower.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&local_colCost.super__Vector_base<double,_std::allocator<double>_>);
  HighsIndexCollection::~HighsIndexCollection(&local_250);
  return HVar5;
}

Assistant:

HighsStatus Highs::addColsInterface(
    HighsInt ext_num_new_col, const double* ext_col_cost,
    const double* ext_col_lower, const double* ext_col_upper,
    HighsInt ext_num_new_nz, const HighsInt* ext_a_start,
    const HighsInt* ext_a_index, const double* ext_a_value) {
  HighsStatus return_status = HighsStatus::kOk;
  HighsOptions& options = options_;
  if (ext_num_new_col < 0) return HighsStatus::kError;
  if (ext_num_new_nz < 0) return HighsStatus::kError;
  if (ext_num_new_col == 0) return HighsStatus::kOk;
  if (ext_num_new_col > 0)
    if (isColDataNull(options.log_options, ext_col_cost, ext_col_lower,
                      ext_col_upper))
      return HighsStatus::kError;
  if (ext_num_new_nz > 0)
    if (isMatrixDataNull(options.log_options, ext_a_start, ext_a_index,
                         ext_a_value))
      return HighsStatus::kError;

  HighsLp& lp = model_.lp_;
  HighsBasis& basis = basis_;
  HighsScale& scale = lp.scale_;
  bool& useful_basis = basis.useful;
  bool& lp_has_scaling = lp.scale_.has_scaling;

  // Check that if nonzeros are to be added then the model has a positive number
  // of rows
  if (lp.num_row_ <= 0 && ext_num_new_nz > 0) return HighsStatus::kError;

  // Record the new number of columns
  HighsInt newNumCol = lp.num_col_ + ext_num_new_col;

  HighsIndexCollection index_collection;
  index_collection.dimension_ = ext_num_new_col;
  index_collection.is_interval_ = true;
  index_collection.from_ = 0;
  index_collection.to_ = ext_num_new_col - 1;

  // Take a copy of the cost and bounds that can be normalised
  std::vector<double> local_colCost{ext_col_cost,
                                    ext_col_cost + ext_num_new_col};
  std::vector<double> local_colLower{ext_col_lower,
                                     ext_col_lower + ext_num_new_col};
  std::vector<double> local_colUpper{ext_col_upper,
                                     ext_col_upper + ext_num_new_col};

  bool local_has_infinite_cost = false;
  return_status = interpretCallStatus(
      options_.log_options,
      assessCosts(options, lp.num_col_, index_collection, local_colCost,
                  local_has_infinite_cost, options.infinite_cost),
      return_status, "assessCosts");
  if (return_status == HighsStatus::kError) return return_status;
  // Assess the column bounds
  return_status = interpretCallStatus(
      options_.log_options,
      assessBounds(options, "Col", lp.num_col_, index_collection,
                   local_colLower, local_colUpper, options.infinite_bound),
      return_status, "assessBounds");
  if (return_status == HighsStatus::kError) return return_status;
  if (lp.user_bound_scale_) {
    // Assess and apply any user bound scaling
    if (!boundScaleOk(local_colLower, local_colUpper, lp.user_bound_scale_,
                      options.infinite_bound)) {
      highsLogUser(options_.log_options, HighsLogType::kError,
                   "User bound scaling yields infinite bound\n");
      return HighsStatus::kError;
    }
    double bound_scale_value = std::pow(2, lp.user_bound_scale_);
    for (HighsInt iCol = 0; iCol < ext_num_new_col; iCol++) {
      local_colLower[iCol] *= bound_scale_value;
      local_colUpper[iCol] *= bound_scale_value;
    }
  }
  if (lp.user_cost_scale_) {
    // Assess and apply any user cost scaling
    if (!costScaleOk(local_colCost, lp.user_cost_scale_,
                     options.infinite_cost)) {
      highsLogUser(options_.log_options, HighsLogType::kError,
                   "User cost scaling yields infinite cost\n");
      return HighsStatus::kError;
    }
    double cost_scale_value = std::pow(2, lp.user_cost_scale_);
    for (HighsInt iCol = 0; iCol < ext_num_new_col; iCol++)
      local_colCost[iCol] *= cost_scale_value;
  }
  // Append the columns to the LP vectors and matrix
  appendColsToLpVectors(lp, ext_num_new_col, local_colCost, local_colLower,
                        local_colUpper);
  // Form a column-wise HighsSparseMatrix of the new matrix columns so
  // that is easy to handle and, if there are nonzeros, it can be
  // normalised
  HighsSparseMatrix local_a_matrix;
  local_a_matrix.num_col_ = ext_num_new_col;
  local_a_matrix.num_row_ = lp.num_row_;
  local_a_matrix.format_ = MatrixFormat::kColwise;
  if (ext_num_new_nz) {
    local_a_matrix.start_ = {ext_a_start, ext_a_start + ext_num_new_col};
    local_a_matrix.start_.resize(ext_num_new_col + 1);
    local_a_matrix.start_[ext_num_new_col] = ext_num_new_nz;
    local_a_matrix.index_ = {ext_a_index, ext_a_index + ext_num_new_nz};
    local_a_matrix.value_ = {ext_a_value, ext_a_value + ext_num_new_nz};
    // Assess the matrix rows
    return_status =
        interpretCallStatus(options_.log_options,
                            local_a_matrix.assess(options.log_options, "LP",
                                                  options.small_matrix_value,
                                                  options.large_matrix_value),
                            return_status, "assessMatrix");
    if (return_status == HighsStatus::kError) return return_status;
  } else {
    // No nonzeros so, whether the constraint matrix is column-wise or
    // row-wise, adding the empty matrix is trivial. Complete the
    // setup of an empty column-wise HighsSparseMatrix of the new
    // matrix columns
    local_a_matrix.start_.assign(ext_num_new_col + 1, 0);
  }
  // Append the columns to LP matrix
  lp.a_matrix_.addCols(local_a_matrix);
  if (lp_has_scaling) {
    // Extend the column scaling factors
    scale.col.resize(newNumCol);
    for (HighsInt iCol = 0; iCol < ext_num_new_col; iCol++)
      scale.col[lp.num_col_ + iCol] = 1.0;
    scale.num_col = newNumCol;
    // Apply the existing row scaling to the new columns
    local_a_matrix.applyRowScale(scale);
    // Consider applying column scaling to the new columns.
    local_a_matrix.considerColScaling(options.allowed_matrix_scale_factor,
                                      &scale.col[lp.num_col_]);
  }
  // Update the basis corresponding to new nonbasic columns
  if (useful_basis) appendNonbasicColsToBasisInterface(ext_num_new_col);

  // Possibly add column names
  lp.addColNames("", ext_num_new_col);

  // Increase the number of columns in the LP
  lp.num_col_ += ext_num_new_col;
  assert(lpDimensionsOk("addCols", lp, options.log_options));

  // Interpret possible introduction of infinite costs
  lp.has_infinite_cost_ = lp.has_infinite_cost_ || local_has_infinite_cost;
  assert(lp.has_infinite_cost_ == lp.hasInfiniteCost(options.infinite_cost));

  // Deduce the consequences of adding new columns
  invalidateModelStatusSolutionAndInfo();

  // Determine any implications for simplex data
  ekk_instance_.addCols(lp, local_a_matrix);

  // Extend any Hessian with zeros on the diagonal
  if (this->model_.hessian_.dim_)
    completeHessian(lp.num_col_, this->model_.hessian_);
  return return_status;
}